

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergefiles.c
# Opt level: O1

econf_err merge_econf_files(econf_file **key_files,econf_file **merged_files)

{
  econf_file *key_file;
  bool bVar1;
  int iVar2;
  econf_err eVar3;
  char *__s1;
  char *__s2;
  econf_err unaff_EBP;
  econf_file **ppeVar4;
  econf_file **ppeVar5;
  econf_file **ppeVar6;
  
  eVar3 = ECONF_ERROR;
  if (merged_files != (econf_file **)0x0 && *key_files != (econf_file *)0x0) {
    *merged_files = *key_files;
    ppeVar5 = key_files + 1;
    do {
      if (*ppeVar5 == (econf_file *)0x0) {
        return ECONF_SUCCESS;
      }
      key_file = *merged_files;
      ppeVar6 = ppeVar5 + 1;
      __s1 = __xpg_basename((*ppeVar5)->path);
      ppeVar4 = ppeVar6;
      do {
        if (*ppeVar4 == (econf_file *)0x0) goto LAB_00105f0d;
        __s2 = __xpg_basename((*ppeVar4)->path);
        iVar2 = strcmp(__s1,__s2);
        ppeVar4 = ppeVar4 + 1;
      } while (iVar2 != 0);
      ppeVar4 = ppeVar4 + ((ulong)(iVar2 != 0) - 1);
LAB_00105f0d:
      if (*ppeVar4 == (econf_file *)0x0) {
        eVar3 = econf_mergeFiles(merged_files,*merged_files,*ppeVar5);
        if ((eVar3 == ECONF_SUCCESS) && (*merged_files != (econf_file *)0x0)) {
          (*merged_files)->on_merge_delete = true;
          if (key_file->on_merge_delete == true) {
            econf_freeFile(key_file);
          }
          goto LAB_00105f14;
        }
        bVar1 = false;
        ppeVar6 = ppeVar5;
        unaff_EBP = eVar3;
      }
      else {
LAB_00105f14:
        bVar1 = true;
        if ((*ppeVar5)->on_merge_delete == true) {
          econf_freeFile(*ppeVar5);
        }
      }
      ppeVar5 = ppeVar6;
      eVar3 = unaff_EBP;
    } while (bVar1);
  }
  return eVar3;
}

Assistant:

econf_err merge_econf_files(econf_file **key_files, econf_file **merged_files) {
  if (*key_files == NULL || merged_files == NULL)
    return ECONF_ERROR;

  *merged_files = *key_files++;
  if(*merged_files == NULL)
    return ECONF_ERROR;

  while(*key_files) {
    econf_err error;
    econf_file *tmp = *merged_files;
    econf_file **double_key_files = key_files+1;
    char * current_file = basename((*key_files)->path);

    /* key_files are already sorted. If there is a file with the same name with
       a higher priority, the current file will be ignored.
       e.g. /usr/etc/shells.d/tcsh will not be merged if /etc/shells.d/tcsh exists.
    */
    while (*double_key_files) {
      char * compare_file = basename((*double_key_files)->path);
      if (strcmp(current_file, compare_file) == 0) {
	break;
      }
      double_key_files++;
    }

    if (*double_key_files == NULL) {
      error = econf_mergeFiles(merged_files, *merged_files, *key_files);
      if (error || *merged_files == NULL)
        return error;
      (*merged_files)->on_merge_delete = 1;
      if(tmp->on_merge_delete) { econf_free(tmp); }
    }

    if((*key_files)->on_merge_delete) { econf_free(*key_files); }

    key_files++;
  }

  return ECONF_SUCCESS;
}